

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O0

void __thiscall Gme_File::Gme_File(Gme_File *this)

{
  long *in_RDI;
  M3u_Playlist *in_stack_ffffffffffffffe0;
  
  *in_RDI = (long)&PTR__Gme_File_00b8ed30;
  M3u_Playlist::M3u_Playlist(in_stack_ffffffffffffffe0);
  blargg_vector<unsigned_char>::blargg_vector((blargg_vector<unsigned_char> *)(in_RDI + 0x18));
  in_RDI[1] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  (**(code **)(*in_RDI + 0x10))();
  blargg_verify_byte_order();
  return;
}

Assistant:

Gme_File::Gme_File()
{
	type_         = 0;
	user_data_    = 0;
	user_cleanup_ = 0;
	unload(); // clears fields
	blargg_verify_byte_order(); // used by most emulator types, so save them the trouble
}